

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExprParserHelper.cxx
# Opt level: O1

int __thiscall cmExprParserHelper::ParseString(cmExprParserHelper *this,char *str,int verb)

{
  char *pcVar1;
  int iVar2;
  long *plVar3;
  size_t sVar4;
  ostream *poVar5;
  ulong *puVar6;
  string e;
  yyscan_t yyscanner;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  long lStack_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  yyscan_t local_b8 [13];
  ulong *local_50;
  long local_48;
  ulong local_40;
  long lStack_38;
  
  if (str == (char *)0x0) {
    iVar2 = 0;
  }
  else {
    this->Verbose = verb;
    pcVar1 = (char *)(this->InputBuffer)._M_string_length;
    strlen(str);
    std::__cxx11::string::_M_replace((ulong)&this->InputBuffer,0,pcVar1,(ulong)str);
    this->InputBufferPos = 0;
    this->CurrentLine = 0;
    this->Result = 0;
    cmExpr_yylex_init(local_b8);
    cmExpr_yyset_extra((cmCommandArgumentParserHelper *)this,local_b8[0]);
    iVar2 = cmExpr_yyparse(local_b8[0]);
    if (iVar2 != 0) {
      std::operator+(&local_d8,"cannot parse the expression: \"",&this->InputBuffer);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_d8);
      puVar6 = (ulong *)(plVar3 + 2);
      if ((ulong *)*plVar3 == puVar6) {
        local_e8 = *puVar6;
        lStack_e0 = plVar3[3];
        local_f8 = &local_e8;
      }
      else {
        local_e8 = *puVar6;
        local_f8 = (ulong *)*plVar3;
      }
      local_f0 = plVar3[1];
      *plVar3 = (long)puVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_append((char *)&local_f8,(ulong)(this->ErrorString)._M_dataplus._M_p)
      ;
      std::__cxx11::string::append((char *)&local_f8);
      if (local_f8 == &local_e8) {
        lStack_38 = lStack_e0;
        local_50 = &local_40;
      }
      else {
        local_50 = local_f8;
      }
      local_40 = local_e8;
      local_48 = local_f0;
      local_f0 = 0;
      local_e8 = local_e8 & 0xffffffffffffff00;
      local_f8 = &local_e8;
      std::__cxx11::string::operator=((string *)&this->ErrorString,(string *)&local_50);
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
    }
    cmExpr_yylex_destroy(local_b8[0]);
    iVar2 = 0;
    if (((this->ErrorString)._M_string_length == 0) && (iVar2 = 1, this->Verbose != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Expanding [",0xb);
      sVar4 = strlen(str);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,str,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"] produced: [",0xd);
      poVar5 = std::ostream::_M_insert<long>((long)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
  }
  return iVar2;
}

Assistant:

int cmExprParserHelper::ParseString(const char* str, int verb)
{
  if (!str) {
    return 0;
  }
  // printf("Do some parsing: %s\n", str);

  this->Verbose = verb;
  this->InputBuffer = str;
  this->InputBufferPos = 0;
  this->CurrentLine = 0;

  this->Result = 0;

  yyscan_t yyscanner;
  cmExpr_yylex_init(&yyscanner);
  cmExpr_yyset_extra(this, yyscanner);

  try {
    int res = cmExpr_yyparse(yyscanner);
    if (res != 0) {
      std::string e = "cannot parse the expression: \"" + InputBuffer + "\": ";
      e += ErrorString;
      e += ".";
      this->SetError(std::move(e));
    }
  } catch (std::runtime_error const& fail) {
    std::string e =
      "cannot evaluate the expression: \"" + InputBuffer + "\": ";
    e += fail.what();
    e += ".";
    this->SetError(std::move(e));
  } catch (std::out_of_range const&) {
    std::string e = "cannot evaluate the expression: \"" + InputBuffer +
      "\": a numeric value is out of range.";
    this->SetError(std::move(e));
  } catch (...) {
    std::string e = "cannot parse the expression: \"" + InputBuffer + "\".";
    this->SetError(std::move(e));
  }
  cmExpr_yylex_destroy(yyscanner);
  if (!this->ErrorString.empty()) {
    return 0;
  }

  if (Verbose) {
    std::cerr << "Expanding [" << str << "] produced: [" << this->Result << "]"
              << std::endl;
  }
  return 1;
}